

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

int Llb_NonlinCompPerms(DdManager *dd,int *pVar2Lev)

{
  int iVar1;
  int iVar2;
  int local_28;
  int Entry;
  int Sum;
  int i;
  DdSubtable *pSubt;
  int *pVar2Lev_local;
  DdManager *dd_local;
  
  local_28 = 0;
  for (Entry = 0; Entry < dd->size; Entry = Entry + 1) {
    if (dd->subtables[dd->perm[Entry]].keys != dd->subtables[dd->perm[Entry]].dead + 1) {
      iVar1 = Abc_MaxInt(dd->perm[Entry],pVar2Lev[Entry]);
      iVar2 = Abc_MinInt(dd->perm[Entry],pVar2Lev[Entry]);
      local_28 = (iVar1 - iVar2) + local_28;
    }
  }
  return local_28;
}

Assistant:

int Llb_NonlinCompPerms( DdManager * dd, int * pVar2Lev )
{
    DdSubtable * pSubt;
    int i, Sum = 0, Entry;
    for ( i = 0; i < dd->size; i++ )
    {
        pSubt = &(dd->subtables[dd->perm[i]]);
        if ( pSubt->keys == pSubt->dead + 1 )
            continue;
        Entry = Abc_MaxInt(dd->perm[i], pVar2Lev[i]) - Abc_MinInt(dd->perm[i], pVar2Lev[i]);
        Sum += Entry;
//printf( "%d-%d(%d) ", dd->perm[i], pV2L[i], Entry );
    }
    return Sum;
}